

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>(string_view data,size_t extra)

{
  size_t this;
  bool bVar1;
  size_t end;
  size_type sVar2;
  unsigned_long *puVar3;
  anon_unknown_0 *this_00;
  size_t in_R8;
  string_view sVar4;
  size_t local_60;
  char *local_58;
  size_t local_50;
  size_type local_48;
  CordRepFlat *local_40;
  CordRepFlat *flat;
  size_t begin;
  size_t length;
  CordRepBtree *leaf;
  size_t extra_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  extra_local = data._M_len;
  leaf = (CordRepBtree *)extra;
  length = (size_t)New(0);
  begin = 0;
  flat = (CordRepFlat *)capacity((CordRepBtree *)length);
  this = length;
  end = capacity((CordRepBtree *)length);
  set_end((CordRepBtree *)this,end);
  while (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                           ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local),
        !bVar1 && flat != (CordRepFlat *)0x0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    local_40 = CordRepFlat::New((size_t)((leaf->super_CordRep).storage + (sVar2 - 0xd)));
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::length
                         ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    local_50 = CordRepFlat::Capacity(local_40);
    puVar3 = std::min<unsigned_long>(&local_48,&local_50);
    (local_40->super_CordRep).length = *puVar3;
    begin = (local_40->super_CordRep).length + begin;
    *(CordRepFlat **)(length + 8 + (long)flat * 8) = local_40;
    flat = (CordRepFlat *)(flat[-1].super_CordRep.storage + 2);
    this_00 = (anon_unknown_0 *)CordRepFlat::Data(local_40);
    sVar4._M_str = (char *)(local_40->super_CordRep).length;
    sVar4._M_len = data_local._M_len;
    sVar4 = anon_unknown_0::Consume<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                      (this_00,(char *)extra_local,sVar4,in_R8);
    local_60 = sVar4._M_len;
    extra_local = local_60;
    local_58 = sVar4._M_str;
    data_local._M_len = (size_t)local_58;
  }
  *(size_t *)length = begin;
  set_begin((CordRepBtree *)length,(size_t)flat);
  return (CordRepBtree *)length;
}

Assistant:

CordRepBtree* CordRepBtree::NewLeaf<kFront>(absl::string_view data,
                                            size_t extra) {
  CordRepBtree* leaf = CordRepBtree::New(0);
  size_t length = 0;
  size_t begin = leaf->capacity();
  leaf->set_end(leaf->capacity());
  while (!data.empty() && begin != 0) {
    auto* flat = CordRepFlat::New(data.length() + extra);
    flat->length = (std::min)(data.length(), flat->Capacity());
    length += flat->length;
    leaf->edges_[--begin] = flat;
    data = Consume<kFront>(flat->Data(), data, flat->length);
  }
  leaf->length = length;
  leaf->set_begin(begin);
  return leaf;
}